

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_padding.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint64_t uVar6;
  int unaff_EBX;
  uint uVar7;
  long lVar8;
  uint_fast16_t uVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  int in_stack_fffffffffffffff0;
  
  auVar4 = _DAT_00171020;
  auVar3 = _DAT_00171010;
  g_prng_rand_state.c = 0x37;
  g_prng_rand_state.i = 0;
  g_prng_rand_state.s[0] = 0x7685dd;
  uVar6 = 0x1007685db;
  lVar8 = 0;
  do {
    auVar12._8_4_ = (int)lVar8;
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar12 = (auVar12 | auVar3) ^ auVar4;
    if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7fffffc1) {
      g_prng_rand_state.s[lVar8 + 1] = uVar6 - 0x7fffffff;
      g_prng_rand_state.s[lVar8 + 2] = uVar6;
    }
    lVar8 = lVar8 + 2;
    uVar6 = uVar6 + 0xfffffffe;
  } while (lVar8 != 0x40);
  lVar8 = 0;
  do {
    uVar9 = g_prng_rand_state.i;
    uVar10 = 0;
    do {
      iVar5 = (int)uVar9;
      iVar2 = (int)uVar10;
      uVar1 = uVar10 + 1;
      g_prng_rand_state.s[iVar5 + iVar2 & 0x3f] =
           g_prng_rand_state.s[iVar5 + iVar2 + 9U & 0x3f] +
           g_prng_rand_state.s[iVar5 + iVar2 + 0x28U & 0x3f];
      if (g_prng_rand_state.c != 0) break;
      bVar11 = uVar10 < 0x1ef;
      uVar10 = uVar1;
    } while (bVar11);
    bVar11 = g_prng_rand_state.c == 0;
    g_prng_rand_state.c = g_prng_rand_state.c - 1;
    if (bVar11) {
      g_prng_rand_state.c = 0x36;
    }
    lVar8 = lVar8 + 1;
    g_prng_rand_state.i = uVar9 + uVar1;
    if (lVar8 == 10000) {
      g_prng_rand_state.i = uVar9 + uVar1;
      uVar7 = 1;
      iVar5 = test_padding(0x10,1,1,1,1,0,0,in_stack_fffffffffffffff0,0.0,unaff_EBX);
      if (iVar5 == 0) {
        uVar7 = 1;
        iVar5 = test_padding(0x10,2,3,2,3,1,0,in_stack_fffffffffffffff0,0.0,unaff_EBX);
        if (((iVar5 == 0) &&
            (iVar5 = test_padding(0x10,4,3,4,3,2,0,in_stack_fffffffffffffff0,0.0,unaff_EBX),
            iVar5 == 0)) &&
           (iVar5 = test_padding(0x10,4,3,4,3,0,0x10,in_stack_fffffffffffffff0,0.0,unaff_EBX),
           iVar5 == 0)) {
          uVar7 = 1;
          iVar5 = test_padding(5,2,3,2,3,1,0,in_stack_fffffffffffffff0,0.0,unaff_EBX);
          if ((iVar5 == 0) &&
             (iVar5 = test_padding(6,4,3,4,3,2,0,in_stack_fffffffffffffff0,0.0,unaff_EBX),
             iVar5 == 0)) {
            uVar7 = 1;
            iVar5 = test_padding(7,0,1,0,1,0,0,in_stack_fffffffffffffff0,233.0,unaff_EBX);
            if (iVar5 == 0) {
              iVar5 = test_padding(3,2,1,2,1,0,3,in_stack_fffffffffffffff0,0.0,unaff_EBX);
              uVar7 = (uint)(iVar5 != 0);
            }
          }
        }
      }
      return uVar7;
    }
  } while( true );
}

Assistant:

int main()
{
    SRAND(7767517);

    return test_padding_0();
}